

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OpenGEXImporter.cpp
# Opt level: O2

void __thiscall Assimp::OpenGEX::OpenGEXImporter::resolveReferences(OpenGEXImporter *this)

{
  RefInfo *pRVar1;
  long lVar2;
  mapped_type_conflict3 mVar3;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
  *this_00;
  pointer puVar4;
  iterator iVar5;
  mapped_type_conflict3 *pmVar6;
  Logger *pLVar7;
  aiMesh *paVar8;
  DeadlyImportError *this_01;
  ulong uVar9;
  long lVar10;
  key_type *__k;
  size_t i;
  allocator local_89;
  OpenGEXImporter *local_88;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
  *local_80;
  pointer local_78;
  aiNode *local_70;
  _Base_ptr local_68;
  _Base_ptr local_60;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
  *local_58;
  string name;
  
  local_78 = (this->m_unresolvedRefStack).
             super__Vector_base<std::unique_ptr<Assimp::OpenGEX::OpenGEXImporter::RefInfo,_std::default_delete<Assimp::OpenGEX::OpenGEXImporter::RefInfo>_>,_std::allocator<std::unique_ptr<Assimp::OpenGEX::OpenGEXImporter::RefInfo,_std::default_delete<Assimp::OpenGEX::OpenGEXImporter::RefInfo>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
  puVar4 = (this->m_unresolvedRefStack).
           super__Vector_base<std::unique_ptr<Assimp::OpenGEX::OpenGEXImporter::RefInfo,_std::default_delete<Assimp::OpenGEX::OpenGEXImporter::RefInfo>_>,_std::allocator<std::unique_ptr<Assimp::OpenGEX::OpenGEXImporter::RefInfo,_std::default_delete<Assimp::OpenGEX::OpenGEXImporter::RefInfo>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (local_78 != puVar4) {
    local_80 = &this->m_material2refMap;
    local_68 = &(this->m_material2refMap)._M_t._M_impl.super__Rb_tree_header._M_header;
    local_58 = &this->m_mesh2refMap;
    local_60 = &(this->m_mesh2refMap)._M_t._M_impl.super__Rb_tree_header._M_header;
    local_88 = this;
    for (; local_78 != puVar4; local_78 = local_78 + 1) {
      pRVar1 = (local_78->_M_t).
               super___uniq_ptr_impl<Assimp::OpenGEX::OpenGEXImporter::RefInfo,_std::default_delete<Assimp::OpenGEX::OpenGEXImporter::RefInfo>_>
               ._M_t.
               super__Tuple_impl<0UL,_Assimp::OpenGEX::OpenGEXImporter::RefInfo_*,_std::default_delete<Assimp::OpenGEX::OpenGEXImporter::RefInfo>_>
               .super__Head_base<0UL,_Assimp::OpenGEX::OpenGEXImporter::RefInfo_*,_false>.
               _M_head_impl;
      if (pRVar1 != (RefInfo *)0x0) {
        if (pRVar1->m_type == MeshRef) {
          local_70 = pRVar1->m_node;
          lVar10 = 0;
          for (uVar9 = 0; this_00 = local_58,
              lVar2 = *(long *)&(pRVar1->m_Names).
                                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                ._M_impl,
              uVar9 < (ulong)((long)*(pointer *)
                                     ((long)&(pRVar1->m_Names).
                                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     + 8) - lVar2 >> 5); uVar9 = uVar9 + 1) {
            __k = (key_type *)(lVar2 + lVar10);
            iVar5 = std::
                    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
                    ::find(&local_58->_M_t,__k);
            if (local_60 != iVar5._M_node) {
              pmVar6 = std::
                       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
                       ::operator[](this_00,__k);
              local_70->mMeshes[uVar9] = (uint)*pmVar6;
            }
            lVar10 = lVar10 + 0x20;
          }
        }
        else {
          if (pRVar1->m_type != MaterialRef) {
            this_01 = (DeadlyImportError *)__cxa_allocate_exception(0x10);
            std::__cxx11::string::string
                      ((string *)&name,"Unknown reference info to resolve.",&local_89);
            DeadlyImportError::DeadlyImportError(this_01,&name);
            __cxa_throw(this_01,&DeadlyImportError::typeinfo,std::runtime_error::~runtime_error);
          }
          lVar10 = 0;
          for (uVar9 = 0;
              lVar2 = *(long *)&(pRVar1->m_Names).
                                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                ._M_impl,
              uVar9 < (ulong)((long)*(pointer *)
                                     ((long)&(pRVar1->m_Names).
                                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     + 8) - lVar2 >> 5); uVar9 = uVar9 + 1) {
            std::__cxx11::string::string((string *)&name,(string *)(lVar2 + lVar10));
            iVar5 = std::
                    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
                    ::find(&local_80->_M_t,&name);
            if (local_68 != iVar5._M_node) {
              if (local_88->m_currentMesh == (aiMesh *)0x0) {
                pLVar7 = DefaultLogger::get();
                Logger::warn(pLVar7,
                             "Cannot resolve material reference, because no current mesh is there.")
                ;
              }
              else {
                pmVar6 = std::
                         map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
                         ::operator[](local_80,&name);
                mVar3 = *pmVar6;
                paVar8 = local_88->m_currentMesh;
                if (paVar8->mMaterialIndex != 0) {
                  pLVar7 = DefaultLogger::get();
                  Logger::warn(pLVar7,
                               "Override of material reference in current mesh by material reference."
                              );
                  paVar8 = local_88->m_currentMesh;
                }
                paVar8->mMaterialIndex = (uint)mVar3;
              }
            }
            std::__cxx11::string::~string((string *)&name);
            lVar10 = lVar10 + 0x20;
          }
        }
      }
      puVar4 = (local_88->m_unresolvedRefStack).
               super__Vector_base<std::unique_ptr<Assimp::OpenGEX::OpenGEXImporter::RefInfo,_std::default_delete<Assimp::OpenGEX::OpenGEXImporter::RefInfo>_>,_std::allocator<std::unique_ptr<Assimp::OpenGEX::OpenGEXImporter::RefInfo,_std::default_delete<Assimp::OpenGEX::OpenGEXImporter::RefInfo>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
    }
  }
  return;
}

Assistant:

void OpenGEXImporter::handleColorNode( ODDLParser::DDLNode *node, aiScene * /*pScene*/ ) {
    if( nullptr == node ) {
        return;
    }

    Property *prop = node->findPropertyByName( "attrib" );
    if( nullptr != prop ) {
        if( nullptr != prop->m_value ) {
            DataArrayList *colList( node->getDataArrayList() );
            if( nullptr == colList ) {
                return;
            }
            aiColor3D col;
            if ( 3 == colList->m_numItems ) {
                aiColor3D col3;
                getColorRGB3( &col3, colList );
                col = col3;
            } else {
                aiColor4D col4;
                getColorRGB4( &col4, colList );
                col.r = col4.r;
                col.g = col4.g;
                col.b = col4.b;
            }
#ifdef ASSIMP_USE_HUNTER
            const ColorType colType( getColorType( &prop->m_key->m_text ) );
#else
            const ColorType colType( getColorType( prop->m_key ) );
#endif
            if( DiffuseColor == colType ) {
                m_currentMaterial->AddProperty( &col, 1, AI_MATKEY_COLOR_DIFFUSE );
            } else if( SpecularColor == colType ) {
                m_currentMaterial->AddProperty( &col, 1, AI_MATKEY_COLOR_SPECULAR );
            } else if( EmissionColor == colType ) {
                m_currentMaterial->AddProperty( &col, 1, AI_MATKEY_COLOR_EMISSIVE );
            } else if ( LightColor == colType ) {
                m_currentLight->mColorDiffuse = col;
            }
        }
    }
}